

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# main.cpp
# Opt level: O0

void __thiscall CLIParser::CLIParser(CLIParser *this,CLICallbacks *cbs_,int argc_,char **argv_)

{
  char **argv__local;
  int argc__local;
  CLICallbacks *cbs__local;
  CLIParser *this_local;
  
  CLICallbacks::CLICallbacks(&this->cbs,cbs_);
  this->argc = argc_;
  this->argv = argv_;
  this->ended_state = false;
  return;
}

Assistant:

CLIParser(CLICallbacks cbs_, int argc_, char *argv_[])
	    : cbs(std::move(cbs_))
	    , argc(argc_)
	    , argv(argv_)
	{
	}